

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inference.cpp
# Opt level: O1

bool __thiscall components::Inference::infer_wumpus(Inference *this,pair<int,_int> room)

{
  bool bVar1;
  pointer ppVar2;
  bool bVar3;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> adjacent_rooms;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_50;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_38;
  
  get_adjacent_rooms(&local_50,(Inference *)room,room);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            (&local_38,&local_50);
  bVar3 = local_38.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          local_38.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  if (!bVar3) {
    bVar3 = false;
    ppVar2 = local_38.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      bVar1 = KnowledgeBase::get_information_visited(this->current_kb,*ppVar2);
      if (!bVar1) break;
      ppVar2 = ppVar2 + 1;
      bVar3 = ppVar2 == local_38.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
    } while (!bVar3);
  }
  if (local_38.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pair<int,_int> *)0x0) {
    operator_delete(local_38.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (bVar3) {
    bVar3 = KnowledgeBase::get_information_stench
                      (this->current_kb,
                       *local_50.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
    ppVar2 = local_50.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    while (ppVar2 = ppVar2 + 1,
          ppVar2 != local_50.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
      if (bVar3 == false) {
        bVar3 = false;
      }
      else {
        bVar3 = KnowledgeBase::get_information_stench(this->current_kb,*ppVar2);
      }
    }
  }
  else {
    bVar3 = false;
  }
  if (local_50.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pair<int,_int> *)0x0) {
    operator_delete(local_50.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar3;
}

Assistant:

bool Inference::infer_wumpus(std::pair<int, int> room){
  std::vector<std::pair<int, int>> adjacent_rooms = get_adjacent_rooms(room);
  if(!validate_conclusion(adjacent_rooms)) return false;

  bool conclusion = current_kb.get_information_stench(adjacent_rooms[0]);
  for(auto itr = adjacent_rooms.begin() + 1; itr != adjacent_rooms.end(); itr++){
    conclusion = conclusion && current_kb.get_information_stench(*itr);
  }
  return conclusion;
}